

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O2

void __thiscall
CoinStatsIndex::CoinStatsIndex
          (CoinStatsIndex *this,
          unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain,
          size_t n_cache_size,bool f_memory,bool f_wipe)

{
  string name;
  bool bVar1;
  long in_FS_OFFSET;
  path path;
  _Alloc_hider in_stack_fffffffffffffed8;
  long *plVar2;
  undefined6 in_stack_fffffffffffffee8;
  path local_108;
  path local_e0;
  path local_b8;
  path local_90;
  path local_68;
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)chain._M_t.
                     super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
                     .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  *(undefined8 *)
   chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
   .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
   super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"coinstatsindex",(allocator<char> *)&local_68);
  name._M_string_length = (size_type)plVar2;
  name._M_dataplus._M_p = in_stack_fffffffffffffed8._M_p;
  name.field_2._M_allocated_capacity._0_6_ = in_stack_fffffffffffffee8;
  name.field_2._M_local_buf[6] = f_wipe;
  name.field_2._M_local_buf[7] = f_memory;
  name.field_2._8_8_ = n_cache_size;
  BaseIndex::BaseIndex
            (&this->super_BaseIndex,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
             &stack0xfffffffffffffee0,name);
  std::__cxx11::string::~string(local_40);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  (this->super_BaseIndex).super_CValidationInterface._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_0114fcb8;
  (this->m_db)._M_t.super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
  super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
  super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl = (DB *)0x0;
  MuHash3072::MuHash3072(&this->m_muhash);
  this->m_total_unspendables_scripts = 0;
  this->m_total_unspendables_unclaimed_rewards = 0;
  this->m_total_unspendables_genesis_block = 0;
  this->m_total_unspendables_bip30 = 0;
  this->m_total_new_outputs_ex_coinbase_amount = 0;
  this->m_total_coinbase_amount = 0;
  this->m_total_unspendable_amount = 0;
  this->m_total_prevout_spent_amount = 0;
  this->m_total_amount = 0;
  this->m_total_subsidy = 0;
  this->m_transaction_output_count = 0;
  this->m_bogo_size = 0;
  ArgsManager::GetDataDirNet((path *)&local_b8,&gArgs);
  fs::operator/((path *)&local_90,(path *)&local_b8,"indexes");
  fs::operator/((path *)&local_68,(path *)&local_90,"coinstats");
  std::filesystem::__cxx11::path::~path(&local_90);
  std::filesystem::__cxx11::path::~path(&local_b8);
  bVar1 = std::filesystem::is_symlink(&local_68);
  if (bVar1) {
    bVar1 = std::filesystem::is_directory(&local_68);
    if (bVar1) goto LAB_006e4820;
  }
  std::filesystem::create_directories((path *)&local_68);
LAB_006e4820:
  std::filesystem::__cxx11::path::path(&local_108,&local_68);
  fs::operator/((path *)&local_e0,(path *)&local_108,"db");
  std::make_unique<BaseIndex::DB,fs::path,unsigned_long&,bool&,bool&>
            ((path *)&stack0xfffffffffffffed8,(unsigned_long *)&local_e0,
             (bool *)&stack0xfffffffffffffef0,(bool *)&stack0xfffffffffffffeef);
  std::__uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::reset
            ((__uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)&this->m_db,
             (pointer)in_stack_fffffffffffffed8._M_p);
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::~unique_ptr
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
             &stack0xfffffffffffffed8);
  std::filesystem::__cxx11::path::~path(&local_e0);
  std::filesystem::__cxx11::path::~path(&local_108);
  std::filesystem::__cxx11::path::~path(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CoinStatsIndex::CoinStatsIndex(std::unique_ptr<interfaces::Chain> chain, size_t n_cache_size, bool f_memory, bool f_wipe)
    : BaseIndex(std::move(chain), "coinstatsindex")
{
    fs::path path{gArgs.GetDataDirNet() / "indexes" / "coinstats"};
    fs::create_directories(path);

    m_db = std::make_unique<CoinStatsIndex::DB>(path / "db", n_cache_size, f_memory, f_wipe);
}